

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextClassifier.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CoreMLModels::TextClassifier::MergeFrom
          (TextClassifier *this,TextClassifier *from)

{
  void *pvVar1;
  string *psVar2;
  string *psVar3;
  LogMessage *other;
  StringVector *this_00;
  StringVector *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/TextClassifier.pb.cc"
               ,0x166);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  psVar2 = (from->language_).ptr_;
  if ((psVar2->_M_string_length != 0) && (psVar3 = (this->language_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->language_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  psVar2 = (from->modelparameterdata_).ptr_;
  if ((psVar2->_M_string_length != 0) &&
     (psVar3 = (this->modelparameterdata_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->modelparameterdata_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  if (from->revision_ != 0) {
    this->revision_ = from->revision_;
  }
  if (from->_oneof_case_[0] != 200) {
    return;
  }
  if (this->_oneof_case_[0] == 200) {
    this_00 = (this->ClassLabels_).stringclasslabels_;
  }
  else {
    this->_oneof_case_[0] = 200;
    this_00 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_00);
    (this->ClassLabels_).stringclasslabels_ = this_00;
    if (from->_oneof_case_[0] != 200) {
      from_00 = StringVector::default_instance();
      goto LAB_004cd8af;
    }
  }
  from_00 = (from->ClassLabels_).stringclasslabels_;
LAB_004cd8af:
  StringVector::MergeFrom(this_00,from_00);
  return;
}

Assistant:

void TextClassifier::MergeFrom(const TextClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CoreMLModels.TextClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.language().size() > 0) {

    language_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.language_);
  }
  if (from.modelparameterdata().size() > 0) {

    modelparameterdata_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.modelparameterdata_);
  }
  if (from.revision() != 0) {
    set_revision(from.revision());
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
}